

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerMemOp(Lowerer *this,Instr *instr)

{
  Func *func_00;
  Instr *insertBeforeInstr_00;
  code *pcVar1;
  RegOpnd *compareSrc1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  LabelInstr *target;
  IntConstOpnd *compareSrc2;
  Instr *local_50;
  Instr *newInstrPrev;
  Instr *insertBeforeInstr;
  Func *func;
  LabelInstr *skipBailOutLabel;
  BailOutKind bailOutKind;
  bool isHelper;
  RegOpnd *helperRet;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  instrPrev = instr;
  instr_local = (Instr *)this;
  if ((instr->m_opcode != Memset) && (instr->m_opcode != Memcopy)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25e7,
                       "(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  helperRet = (RegOpnd *)instrPrev->m_prev;
  _bailOutKind = IR::RegOpnd::New(TyInt8,instrPrev->m_func);
  skipBailOutLabel._7_1_ = 0;
  bVar2 = IR::Instr::HasBailOutInfo(instrPrev);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25ec,"(instr->HasBailOutInfo())","Expected bailOut on MemOp instruction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Instr::HasBailOutInfo(instrPrev);
  if (bVar2) {
    skipBailOutLabel._0_4_ = IR::Instr::GetBailOutKind(instrPrev);
    BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnInvalidatedArrayHeadSegment);
    if (BVar3 == BailOutInvalid) {
      BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnMissingValue);
      if (BVar3 != BailOutInvalid) {
        LowerBailOnCreatedMissingValue(this,instrPrev,false);
        IR::operator^=((BailOutKind *)&skipBailOutLabel,BailOutOnMissingValue);
        bVar2 = IR::operator!((BailOutKind)skipBailOutLabel);
        if ((!bVar2) &&
           (BVar3 = IR::Instr::GetBailOutKind(instrPrev), BVar3 != (BailOutKind)skipBailOutLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x25fb,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    else {
      BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnMissingValue);
      bVar2 = IR::operator!(BVar3);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x25f2,"(!(bailOutKind & IR::BailOutOnMissingValue))",
                           "!(bailOutKind & IR::BailOutOnMissingValue)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      LowerBailOnInvalidatedArrayHeadSegment(this,instrPrev,false);
      IR::operator^=((BailOutKind *)&skipBailOutLabel,BailOutOnInvalidatedArrayHeadSegment);
      bVar2 = IR::operator!((BailOutKind)skipBailOutLabel);
      if ((!bVar2) &&
         (BVar3 = IR::Instr::GetBailOutKind(instrPrev), BVar3 != (BailOutKind)skipBailOutLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x25f5,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                           "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnInvalidatedArrayLength);
    if (BVar3 != BailOutInvalid) {
      LowerBailOnInvalidatedArrayLength(this,instrPrev,false);
      IR::operator^=((BailOutKind *)&skipBailOutLabel,BailOutOnInvalidatedArrayLength);
      bVar2 = IR::operator!((BailOutKind)skipBailOutLabel);
      if ((!bVar2) &&
         (BVar3 = IR::Instr::GetBailOutKind(instrPrev), BVar3 != (BailOutKind)skipBailOutLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2601,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                           "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnMemOpError);
    bVar2 = IR::operator!(BVar3);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2604,"(bailOutKind & IR::BailOutOnMemOpError)",
                         "Expected BailOutOnMemOpError on MemOp instruction");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IR::operator&((BailOutKind)skipBailOutLabel,BailOutOnMemOpError);
    if (BVar3 != BailOutInvalid) {
      target = IR::Instr::GetOrCreateContinueLabel(instrPrev,false);
      func_00 = instrPrev->m_func;
      LowerOneBailOutKind(this,instrPrev,BailOutOnMemOpError,false,false);
      compareSrc1 = _bailOutKind;
      insertBeforeInstr_00 = instrPrev->m_next;
      compareSrc2 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
      InsertCompareBranch(this,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,target,
                          insertBeforeInstr_00,false);
      IR::operator^=((BailOutKind *)&skipBailOutLabel,BailOutOnMemOpError);
      bVar2 = IR::operator!((BailOutKind)skipBailOutLabel);
      if ((!bVar2) &&
         (BVar3 = IR::Instr::GetBailOutKind(instrPrev), BVar3 != (BailOutKind)skipBailOutLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x261a,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                           "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    IR::Instr::ClearBailOutInfo(instrPrev);
  }
  local_50 = (Instr *)0x0;
  if (instrPrev->m_opcode == Memset) {
    local_50 = LowerMemset(this,instrPrev,_bailOutKind);
  }
  else if (instrPrev->m_opcode == Memcopy) {
    local_50 = LowerMemcopy(this,instrPrev,_bailOutKind);
  }
  if (local_50 != (Instr *)0x0) {
    helperRet = (RegOpnd *)local_50;
  }
  return (Instr *)helperRet;
}

Assistant:

IR::Instr *
Lowerer::LowerMemOp(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    IR::Instr *instrPrev = instr->m_prev;

    IR::RegOpnd* helperRet = IR::RegOpnd::New(TyInt8, instr->m_func);
    const bool isHelper = false;
    AssertMsg(instr->HasBailOutInfo(), "Expected bailOut on MemOp instruction");
    if (instr->HasBailOutInfo())
    {
        IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if (bailOutKind & IR::BailOutOnInvalidatedArrayHeadSegment)
        {
            Assert(!(bailOutKind & IR::BailOutOnMissingValue));
            LowerBailOnInvalidatedArrayHeadSegment(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayHeadSegment;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        else if (bailOutKind & IR::BailOutOnMissingValue)
        {
            LowerBailOnCreatedMissingValue(instr, isHelper);
            bailOutKind ^= IR::BailOutOnMissingValue;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if (bailOutKind & IR::BailOutOnInvalidatedArrayLength)
        {
            LowerBailOnInvalidatedArrayLength(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayLength;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        AssertMsg(bailOutKind & IR::BailOutOnMemOpError, "Expected BailOutOnMemOpError on MemOp instruction");
        if (bailOutKind & IR::BailOutOnMemOpError)
        {
            // Insert or get continue label
            IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isHelper);
            Func *const func = instr->m_func;
            LowerOneBailOutKind(instr, IR::BailOutOnMemOpError, isHelper);
            IR::Instr *const insertBeforeInstr = instr->m_next;

            //     test helperRet, helperRet
            //     jz $skipBailOut
            InsertCompareBranch(
                helperRet,
                IR::IntConstOpnd::New(0, TyInt8, func),
                Js::OpCode::BrNeq_A,
                skipBailOutLabel,
                insertBeforeInstr);

            //     (Bail out with IR::BailOutOnMemOpError)
            //     $skipBailOut:

            bailOutKind ^= IR::BailOutOnMemOpError;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        instr->ClearBailOutInfo();
    }

    IR::Instr* newInstrPrev = nullptr;
    if (instr->m_opcode == Js::OpCode::Memset)
    {
        newInstrPrev = LowerMemset(instr, helperRet);
    }
    else if (instr->m_opcode == Js::OpCode::Memcopy)
    {
        newInstrPrev = LowerMemcopy(instr, helperRet);
    }

    if (newInstrPrev != nullptr)
    {
        instrPrev = newInstrPrev;
    }
    return instrPrev;
}